

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O0

LY_ERR json_print_attribute(jsonpr_ctx *pctx,lyd_node_opaq *node)

{
  char *local_30;
  lyd_attr *local_20;
  lyd_attr *attr;
  lyd_node_opaq *node_local;
  jsonpr_ctx *pctx_local;
  
  for (local_20 = node->attr; local_20 != (lyd_attr *)0x0; local_20 = local_20->next) {
    json_print_member2(pctx,(lyd_node *)node,local_20->format,&local_20->name,'\0');
    if ((local_20->hints & 0x1d) == 0) {
      if ((local_20->hints & 0x22) == 0) {
        if ((local_20->hints & 0x40) == 0) {
          json_print_string(pctx->out,local_20->value);
        }
        else {
          ly_print_(pctx->out,"[null]");
        }
      }
      else {
        if (*local_20->value == '\0') {
          local_30 = "null";
        }
        else {
          local_30 = local_20->value;
        }
        ly_print_(pctx->out,"%s",local_30);
      }
    }
    else {
      json_print_string(pctx->out,local_20->value);
    }
    pctx->level_printed = pctx->level;
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
json_print_attribute(struct jsonpr_ctx *pctx, const struct lyd_node_opaq *node)
{
    struct lyd_attr *attr;

    for (attr = node->attr; attr; attr = attr->next) {
        json_print_member2(pctx, &node->node, attr->format, &attr->name, 0);

        if (attr->hints & (LYD_VALHINT_STRING | LYD_VALHINT_OCTNUM | LYD_VALHINT_HEXNUM | LYD_VALHINT_NUM64)) {
            json_print_string(pctx->out, attr->value);
        } else if (attr->hints & (LYD_VALHINT_BOOLEAN | LYD_VALHINT_DECNUM)) {
            ly_print_(pctx->out, "%s", attr->value[0] ? attr->value : "null");
        } else if (attr->hints & LYD_VALHINT_EMPTY) {
            ly_print_(pctx->out, "[null]");
        } else {
            /* unknown value format with no hints, use universal string */
            json_print_string(pctx->out, attr->value);
        }
        LEVEL_PRINTED;
    }

    return LY_SUCCESS;
}